

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_file.c
# Opt level: O0

ion_err_t flat_file_initialize
                    (ion_flat_file_t *flat_file,ion_dictionary_id_t id,ion_key_type_t key_type,
                    ion_key_size_t key_size,ion_value_size_t value_size,
                    ion_dictionary_size_t dictionary_size)

{
  int iVar1;
  FILE *pFVar2;
  long lVar3;
  ion_byte_t *piVar4;
  undefined1 local_60 [7];
  ion_err_t err;
  ion_flat_file_row_t row;
  ion_fpos_t loc;
  char local_38 [4];
  int actual_filename_length;
  char filename [12];
  ion_dictionary_size_t dictionary_size_local;
  ion_value_size_t value_size_local;
  ion_key_size_t key_size_local;
  ion_key_type_t key_type_local;
  ion_dictionary_id_t id_local;
  ion_flat_file_t *flat_file_local;
  
  filename._4_4_ = dictionary_size;
  if (dictionary_size == 0) {
    filename[4] = '\x01';
    filename[5] = '\0';
    filename[6] = '\0';
    filename[7] = '\0';
  }
  (flat_file->super).key_type = key_type;
  (flat_file->super).record.key_size = key_size;
  (flat_file->super).record.value_size = value_size;
  filename._8_4_ = value_size;
  loc._4_4_ = dictionary_get_filename(id,"ffs",local_38);
  if (loc._4_4_ < 0xc) {
    flat_file->sorted_mode = '\0';
    flat_file->num_buffered = filename._4_4_;
    flat_file->current_loaded_region = -1;
    pFVar2 = fopen(local_38,"r+b");
    flat_file->data_file = (FILE *)pFVar2;
    if (flat_file->data_file == (FILE *)0x0) {
      pFVar2 = fopen(local_38,"w+b");
      flat_file->data_file = (FILE *)pFVar2;
      if (flat_file->data_file == (FILE *)0x0) {
        return '\t';
      }
    }
    loc._0_4_ = 0xadde;
    fwrite(&loc,4,1,(FILE *)flat_file->data_file);
    lVar3 = ftell((FILE *)flat_file->data_file);
    flat_file->start_of_data = lVar3;
    if (flat_file->start_of_data == -1) {
      fclose((FILE *)flat_file->data_file);
      flat_file_local._7_1_ = '\b';
    }
    else {
      flat_file->row_size = (long)key_size + 1 + (long)(int)filename._8_4_;
      piVar4 = (ion_byte_t *)calloc((ulong)flat_file->num_buffered,flat_file->row_size);
      flat_file->buffer = piVar4;
      if (flat_file->buffer == (ion_byte_t *)0x0) {
        fclose((FILE *)flat_file->data_file);
        flat_file_local._7_1_ = '\x06';
      }
      else {
        iVar1 = fseek((FILE *)flat_file->data_file,0,2);
        if (iVar1 == 0) {
          lVar3 = ftell((FILE *)flat_file->data_file);
          flat_file->eof_position = lVar3;
          if (flat_file->eof_position == -1) {
            fclose((FILE *)flat_file->data_file);
            flat_file_local._7_1_ = '\b';
          }
          else {
            row.value = (ion_value_t)0xffffffffffffffff;
            flat_file_local._7_1_ =
                 flat_file_scan(flat_file,-1,(ion_fpos_t *)&row.value,
                                (ion_flat_file_row_t *)local_60,'\0',flat_file_predicate_not_empty);
            if ((flat_file_local._7_1_ == '\0') || (flat_file_local._7_1_ == '\x0e')) {
              if (flat_file_local._7_1_ == '\x0e') {
                row.value = (ion_value_t)0xffffffffffffffff;
              }
              flat_file->eof_position =
                   flat_file->start_of_data + ((long)row.value + 1) * flat_file->row_size;
              flat_file_local._7_1_ = '\0';
            }
            else {
              fclose((FILE *)flat_file->data_file);
            }
          }
        }
        else {
          fclose((FILE *)flat_file->data_file);
          flat_file_local._7_1_ = '\r';
        }
      }
    }
  }
  else {
    flat_file_local._7_1_ = '\x12';
  }
  return flat_file_local._7_1_;
}

Assistant:

ion_err_t
flat_file_initialize(
	ion_flat_file_t			*flat_file,
	ion_dictionary_id_t		id,
	ion_key_type_t			key_type,
	ion_key_size_t			key_size,
	ion_value_size_t		value_size,
	ion_dictionary_size_t	dictionary_size
) {
	if (dictionary_size <= 0) {
		/* Clamp the dictionary size since we always need at least 1 row to buffer */
		dictionary_size = 1;
	}

	flat_file->super.key_type			= key_type;
	flat_file->super.record.key_size	= key_size;
	flat_file->super.record.value_size	= value_size;

	char	filename[ION_MAX_FILENAME_LENGTH];
	int		actual_filename_length = dictionary_get_filename(id, "ffs", filename);

	if (actual_filename_length >= ION_MAX_FILENAME_LENGTH) {
		return err_uninitialized;
	}

	flat_file->sorted_mode				= boolean_false;/* By default, we don't use sorted mode */
	flat_file->num_buffered				= dictionary_size;
	flat_file->current_loaded_region	= -1;	/* No loaded region yet */

	flat_file->data_file				= fopen(filename, "r+b");

	if (NULL == flat_file->data_file) {
		/* The file did not exist - lets open to write */
		flat_file->data_file = fopen(filename, "w+b");

		if (NULL == flat_file->data_file) {
			/* Failed to open, even to create */
			return err_file_open_error;
		}
	}

	/* For now, we don't have any header information. But we write some garbage there just so that
	   we can verify that the code to handle the header is working.*/
	fwrite(&(int) { 0xADDE }, sizeof(int), 1, flat_file->data_file);
	flat_file->start_of_data = ftell(flat_file->data_file);

	if (-1 == flat_file->start_of_data) {
		fclose(flat_file->data_file);
		return err_file_read_error;
	}

	/* A record is laid out as: | STATUS |	  KEY	 |	   VALUE	  | */
	/*				   Bytes:	(1)	 (key_size)   (value_size)	*/
	flat_file->row_size = sizeof(ion_flat_file_row_status_t) + key_size + value_size;
	flat_file->buffer	= calloc(flat_file->num_buffered, flat_file->row_size);

	if (NULL == flat_file->buffer) {
		fclose(flat_file->data_file);
		return err_out_of_memory;
	}

	if (0 != fseek(flat_file->data_file, 0, SEEK_END)) {
		fclose(flat_file->data_file);
		return err_file_bad_seek;
	}

	flat_file->eof_position = ftell(flat_file->data_file);

	if (-1 == flat_file->eof_position) {
		fclose(flat_file->data_file);
		return err_file_read_error;
	}

	/* Now move the eof to the last non-empty row in the file */
	ion_fpos_t			loc = -1;
	ion_flat_file_row_t row;
	ion_err_t			err = flat_file_scan(flat_file, -1, &loc, &row, ION_FLAT_FILE_SCAN_BACKWARDS, flat_file_predicate_not_empty);

	if ((err_ok != err) && (err_file_hit_eof != err)) {
		fclose(flat_file->data_file);
		return err;
	}

	if (err_file_hit_eof == err) {
		/* Then there are no occupied rows in the file. We'll set to the start of data. */
		loc = -1;
	}

	/* Move to its final position as one-past the position found. */
	flat_file->eof_position = flat_file->start_of_data + (loc + 1) * flat_file->row_size;

	return err_ok;
}